

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_model<TreesIndexer,char_const*>
               (TreesIndexer *model,char **in,bool has_same_endianness,bool has_same_int_size,
               bool has_same_size_t_size,PlatformSize saved_int_t,PlatformSize saved_size_t,
               bool lacks_range_penalty,bool lacks_scoring_metric)

{
  runtime_error *this;
  bool diff_endian;
  PlatformSize PVar1;
  vector<char,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  diff_endian = !has_same_endianness;
  if (((~(has_same_int_size && has_same_size_t_size) | diff_endian | lacks_range_penalty |
       lacks_scoring_metric) & 1U) == 0) {
    deserialize_model<char_const*>(model,in);
    return;
  }
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  PVar1 = saved_size_t ^ Is32Bit;
  if ((saved_int_t ^ Is16Bit) == 0 && PVar1 == 0) {
    deserialize_model<char_const*,short,unsigned_int>
              (model,in,&local_168,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
  else if ((saved_int_t ^ Is32Bit) == 0 && PVar1 == 0) {
    deserialize_model<char_const*,int,unsigned_int>
              (model,in,&local_168,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
  else if (saved_int_t == Is64Bit && PVar1 == 0) {
    deserialize_model<char_const*,long,unsigned_int>
              (model,in,&local_168,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
  else {
    if ((saved_int_t ^ Is16Bit) != 0 || (saved_size_t ^ Is64Bit) != 0) {
      if ((saved_int_t ^ Is32Bit) == 0 && (saved_size_t ^ Is64Bit) == 0) {
        deserialize_model<char_const*,int,unsigned_long>
                  (model,in,&local_168,diff_endian,lacks_range_penalty,lacks_scoring_metric);
        goto LAB_0034cbd2;
      }
      if ((saved_int_t != Is64Bit) || (saved_size_t != Is64Bit)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Unexpected error in ","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/serialize.cpp"
                   ,"");
        std::operator+(&local_b0,&local_150,&local_f0);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,":","");
        std::operator+(&local_90,&local_b0,&local_110);
        std::__cxx11::to_string(&local_d0,0xff9);
        std::operator+(&local_70,&local_90,&local_d0);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                   ,"");
        std::operator+(&local_50,&local_70,&local_130);
        std::runtime_error::runtime_error(this,(string *)&local_50);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    deserialize_model<char_const*,short,unsigned_long>
              (model,in,&local_168,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
LAB_0034cbd2:
  if (local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void deserialize_model
(
    Model &model,
    itype &in,
    const bool has_same_endianness,
    const bool has_same_int_size,
    const bool has_same_size_t_size,
    const PlatformSize saved_int_t,
    const PlatformSize saved_size_t,
    const bool lacks_range_penalty,
    const bool lacks_scoring_metric
)
{
    if (has_same_endianness && has_same_int_size && has_same_size_t_size && !lacks_range_penalty && !lacks_scoring_metric)
    {
        deserialize_model(model, in);
        return;
    }

    std::vector<char> buffer;

    if (saved_int_t == Is16Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int16_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is32Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int32_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is64Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int64_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is16Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is32Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int32_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is64Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else
    {
        unexpected_error();
    }
}